

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmVarHeapHybrid::free_mem(CVmVarHeapHybrid *this,void *mem)

{
  long *plVar1;
  long in_RSI;
  CVmVarHeapHybrid_hdr *hdr;
  
  plVar1 = *(long **)(in_RSI + -8);
  (**(code **)(*plVar1 + 0x18))(plVar1,(undefined8 *)(in_RSI + -8));
  return;
}

Assistant:

void CVmVarHeapHybrid::free_mem(void *mem)
{
    CVmVarHeapHybrid_hdr *hdr;

    /* 
     *   get the block header, which immediately precedes the
     *   caller-visible block 
     */
    hdr = ((CVmVarHeapHybrid_hdr *)mem) - 1;

    /* count the gc statistics if desired */
    IF_GC_STATS(gc_stats.count_free_bytes(hdr->siz));

    /* 
     *   read the header to get the block manager that originally
     *   allocated the memory, and ask it to free the memory 
     */
    hdr->block->free(hdr);
}